

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_0000017c;
  size_t in_stack_00000180;
  uchar *in_stack_00000188;
  uint *in_stack_00000190;
  uint *in_stack_00000198;
  uchar **in_stack_000001a0;
  uint in_stack_000001b0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uchar **in_stack_ffffffffffffffc8;
  
  uVar1 = lodepng_load_file(in_stack_ffffffffffffffc8,
                            (size_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (uVar1 == 0) {
    uVar1 = lodepng_decode_memory
                      (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
                       in_stack_00000180,in_stack_0000017c,in_stack_000001b0);
  }
  lodepng_free((void *)0x11edf2);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
	LodePNGColorType colortype, unsigned bitdepth)
{
	unsigned char* buffer = 0;
	size_t buffersize;
	unsigned error;
	error = lodepng_load_file(&buffer, &buffersize, filename);
	if (!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
	lodepng_free(buffer);
	return error;
}